

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EmitterBeam::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EmitterBeam *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pTVar3;
  KINT32 Value;
  KINT32 Value_00;
  KString local_300;
  KString local_2e0;
  __normal_iterator<const_KDIS::DATA_TYPE::TrackJamTargetIdentifier_*,_std::vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>_>
  local_2c0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EmitterBeam *local_18;
  EmitterBeam *this_local;
  
  local_18 = this;
  this_local = (EmitterBeam *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Emitter Beam:\n\t");
  poVar2 = std::operator<<(poVar2,"\n\tBeam Data Length (32bits):        ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8BeamDataLength);
  poVar2 = std::operator<<(poVar2,"\n\tEmitter Beam ID Number:           ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8EmitterBeamIDNumber);
  poVar2 = std::operator<<(poVar2,"\n\tBeam Parameter Index:             ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16BeamParamIndex);
  FundamentalParameterData::GetAsString_abi_cxx11_(&local_1f0,&this->m_FundamentalParameterData);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"\tBeam Function:                    ");
  ENUMS::GetEnumAsStringEmitterFunction_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)this->m_ui8BeamFunction,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Targets Tracked/Jammed: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumTargetInTrackJamField);
  poVar2 = std::operator<<(poVar2,"\n\tHigh Density Track/Jam:           ");
  ENUMS::GetEnumAsStringHighDensityTrackJam_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)this->m_ui8HighDensityTrackJam,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  BeamStatus::GetAsString_abi_cxx11_(&local_270,&this->m_BeamStatus);
  UTILS::IndentString(&local_250,&local_270,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  JammingTechnique::GetAsString_abi_cxx11_((KString *)&citr,&this->m_JammingTechnique);
  UTILS::IndentString(&local_290,(KString *)&citr,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  std::operator<<(poVar2,"\n\tTracked/Jammed Targets:\n");
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
            ::begin(&this->m_vTrackJamTargets);
  local_2c0._M_current =
       (TrackJamTargetIdentifier *)
       std::
       vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
       ::end(&this->m_vTrackJamTargets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_2c0);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"Target:\n");
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::TrackJamTargetIdentifier_*,_std::vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>_>
             ::operator->(&citrEnd);
    (*(pTVar3->super_EntityIdentifier).super_SimulationIdentifier.super_DataTypeBase.
      _vptr_DataTypeBase[2])(&local_300);
    UTILS::IndentString(&local_2e0,&local_300,1,'\t');
    std::operator<<(poVar2,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::TrackJamTargetIdentifier_*,_std::vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EmitterBeam::GetAsString() const
{
    KStringStream ss;

    ss << "Emitter Beam:\n\t"
       << "\n\tBeam Data Length (32bits):        " << ( KUINT16 )m_ui8BeamDataLength
       << "\n\tEmitter Beam ID Number:           " << ( KUINT16 )m_ui8EmitterBeamIDNumber
       << "\n\tBeam Parameter Index:             " << m_ui16BeamParamIndex
       << IndentString( m_FundamentalParameterData.GetAsString(), 1 )
       << "\tBeam Function:                    "   << GetEnumAsStringEmitterFunction( m_ui8BeamFunction )
       << "\n\tNumber Of Targets Tracked/Jammed: " << ( KUINT16 )m_ui8NumTargetInTrackJamField
       << "\n\tHigh Density Track/Jam:           " <<  GetEnumAsStringHighDensityTrackJam( m_ui8HighDensityTrackJam )
#if DIS_VERSION < 7
       << "\n\tJamming Mode Sequence:            " << m_ui32JammingModeSequence
#elif DIS_VERSION > 6
       << IndentString( m_BeamStatus.GetAsString(), 1 )
       << IndentString( m_JammingTechnique.GetAsString(), 1 )
#endif
       << "\n\tTracked/Jammed Targets:\n";

    vector<TrackJamTargetIdentifier>::const_iterator citr = m_vTrackJamTargets.begin();
    vector<TrackJamTargetIdentifier>::const_iterator citrEnd = m_vTrackJamTargets.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << "Target:\n"
           << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}